

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O2

qint64 __thiscall QFileDevice::writeData(QFileDevice *this,char *data,qint64 len)

{
  QIODevicePrivate *pQVar1;
  QRingBuffer *pQVar2;
  bool bVar3;
  FileError FVar4;
  long lVar5;
  long lVar6;
  FileError FVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QIODevice).d_ptr._M_t.
           super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
           super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
           super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl;
  unsetError(this);
  *(undefined1 *)&pQVar1[1].transactionPos = 1;
  if ((*(byte *)&(pQVar1->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                 super_QFlagsStorage<QIODeviceBase::OpenModeFlag> & 0x20) == 0) {
    pQVar2 = (pQVar1->writeBuffer).m_buf;
    if (pQVar2 == (QRingBuffer *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = pQVar2->bufferSize;
    }
    lVar6 = (long)pQVar1->writeBufferChunkSize;
    if (lVar6 < lVar5 + len) {
      bVar3 = flush(this);
      if (!bVar3) {
        len = -1;
        goto LAB_0010c44d;
      }
      lVar6 = (long)pQVar1->writeBufferChunkSize;
    }
    if (len <= lVar6) {
      QIODevicePrivate::QRingBufferRef::append(&pQVar1->writeBuffer,data,len);
      goto LAB_0010c44d;
    }
  }
  len = (**(code **)(*pQVar1[1]._vptr_QIODevicePrivate + 0x128))
                  (pQVar1[1]._vptr_QIODevicePrivate,data,len);
  if (len < 0) {
    FVar4 = QAbstractFileEngine::error((QAbstractFileEngine *)pQVar1[1]._vptr_QIODevicePrivate);
    FVar7 = WriteError;
    if (FVar4 != UnspecifiedError) {
      FVar7 = FVar4;
    }
    QAbstractFileEngine::errorString
              ((QString *)&QStack_48,(QAbstractFileEngine *)pQVar1[1]._vptr_QIODevicePrivate);
    *(FileError *)((long)&pQVar1[1].devicePos + 4) = FVar7;
    QString::operator=(&pQVar1->errorString,(QString *)&QStack_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
  }
LAB_0010c44d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return len;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QFileDevice::writeData(const char *data, qint64 len)
{
    Q_D(QFileDevice);
    unsetError();
    d->lastWasWrite = true;
    bool buffered = !(d->openMode & Unbuffered);

    // Flush buffered data if this read will overflow.
    if (buffered && (d->writeBuffer.size() + len) > d->writeBufferChunkSize) {
        if (!flush())
            return -1;
    }

    // Write directly to the engine if the block size is larger than
    // the write buffer size.
    if (!buffered || len > d->writeBufferChunkSize) {
        const qint64 ret = d->fileEngine->write(data, len);
        if (ret < 0) {
            QFileDevice::FileError err = d->fileEngine->error();
            if (err == QFileDevice::UnspecifiedError)
                err = QFileDevice::WriteError;
            d->setError(err, d->fileEngine->errorString());
        }
        return ret;
    }

    // Write to the buffer.
    d->writeBuffer.append(data, len);
    return len;
}